

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.cpp
# Opt level: O1

bool __thiscall SkipList::containsElement(SkipList *this,int value)

{
  Element *pEVar1;
  bool bVar2;
  long lVar3;
  Element *pEVar4;
  
  pEVar4 = &this->head;
  pEVar1 = pEVar4;
  lVar3 = (long)this->height;
  if (-1 < (long)this->height) {
    do {
      do {
        pEVar4 = pEVar1;
        pEVar1 = (pEVar4->next).
                 super__Vector_base<SkipList::Element_*,_std::allocator<SkipList::Element_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[lVar3];
      } while (pEVar1->value < value);
      bVar2 = 0 < lVar3;
      pEVar1 = pEVar4;
      lVar3 = lVar3 + -1;
    } while (bVar2);
  }
  return (*(pEVar4->next).
           super__Vector_base<SkipList::Element_*,_std::allocator<SkipList::Element_*>_>._M_impl.
           super__Vector_impl_data._M_start)->value == value;
}

Assistant:

bool SkipList::containsElement(int value) {
    Element *p = &head;
    for (int i = height; i >= 0; --i) {
        while (p->next[i]->value < value) {
            p = p->next[i];
        }
    }

    // now either p == &head and x <= p->next[0]->key
    // or p != &head and p->key < x <= p->next[0]->key
    p = p->next[0];
    return p->value == value;  // x is at position p in list or in list
}